

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void mjs::debug_print(wostream *os,value *v,int indent_incr,int max_nest,int indent)

{
  wchar_t wVar1;
  bool bVar2;
  gc_heap_ptr_untyped *this;
  object *this_00;
  reference *prVar3;
  string *this_01;
  wostream *pwVar4;
  mjs *this_02;
  char *pcVar5;
  long lVar6;
  double m;
  wstring_view wVar7;
  object_ptr b;
  undefined1 local_60 [16];
  wstring local_50;
  
  this_02 = (mjs *)(ulong)v->type_;
  switch(this_02) {
  case (mjs *)0x0:
  case (mjs *)0x1:
    operator<<(os,v->type_);
    return;
  case (mjs *)0x2:
    bVar2 = value::boolean_value(v);
    pcVar5 = "false";
    if (bVar2) {
      pcVar5 = "true";
    }
    break;
  case (mjs *)0x3:
    m = value::number_value(v);
    number_to_string_abi_cxx11_(&local_50,this_02,m);
    std::operator<<(os,(wstring *)&local_50);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
    return;
  case (mjs *)0x4:
    std::operator<<(os,"\'");
    this_01 = value::string_value(v);
    wVar7 = string::view(this_01);
    for (lVar6 = 0; wVar7._M_len << 2 != lVar6; lVar6 = lVar6 + 4) {
      wVar1 = *(wchar_t *)((long)wVar7._M_str + lVar6);
      switch(wVar1) {
      case L'\b':
        pcVar5 = "\\b";
        break;
      case L'\t':
        pcVar5 = "\\t";
        break;
      case L'\n':
        pcVar5 = "\\n";
        break;
      case L'\v':
switchD_0015979e_caseD_b:
        std::operator<<(os,wVar1);
        goto LAB_00159807;
      case L'\f':
        pcVar5 = "\\f";
        break;
      case L'\r':
        pcVar5 = "\\r";
        break;
      default:
        if (wVar1 == L'\\') {
          pcVar5 = "\\\\";
        }
        else {
          if (wVar1 != L'\'') goto switchD_0015979e_caseD_b;
          pcVar5 = "\\\'";
        }
      }
      std::operator<<(os,pcVar5);
LAB_00159807:
    }
    pcVar5 = "\'";
    break;
  case (mjs *)0x5:
    this = &value::object_value(v)->super_gc_heap_ptr_untyped;
    this_00 = (object *)gc_heap_ptr_untyped::get(this);
    object::debug_print(this_00,os,indent_incr,max_nest,indent);
    return;
  case (mjs *)0x6:
    std::operator<<(os,"reference to ");
    prVar3 = value::reference_value(v);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_50,(gc_heap_ptr_untyped *)prVar3);
    if (local_50._M_dataplus._M_p == (pointer)0x0) {
      std::operator<<(os,"null");
    }
    else {
      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_50);
      object::class_name((object *)local_60);
      operator<<(os,(string *)local_60);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_60);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_50);
    pwVar4 = std::operator<<(os," \'");
    prVar3 = value::reference_value(v);
    wVar7 = string::view(&prVar3->property_name_);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar4,wVar7._M_str,wVar7._M_len);
    std::operator<<(pwVar4,"\'");
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp",
                  0x113,"void mjs::debug_print(std::wostream &, const value &, int, int, int)");
  }
  std::operator<<(os,pcVar5);
  return;
}

Assistant:

void debug_print(std::wostream& os, const value& v, int indent_incr, int max_nest, int indent) {
    switch (v.type()) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:
        os << v.type();
        break;
    case value_type::boolean:
        os << (v.boolean_value() ? "true" : "false");
        break;
    case value_type::number:
        os << number_to_string(v.number_value());
        break;
    case value_type::string:
        os << "'";
        for (const auto& ch: v.string_value().view()) {
            switch (ch) {
            case '\'': os << "\\'"; break;
            case '\\': os << "\\\\"; break;
            case '\b': os << "\\b"; break;
            case '\f': os << "\\f"; break;
            case '\n': os << "\\n"; break;
            case '\r': os << "\\r"; break;
            case '\t': os << "\\t"; break;
            default:
                os << ch;
            }
        }
        os << "'";
        break;
    case value_type::object:
        v.object_value()->debug_print(os, indent_incr, max_nest, indent);
        break;
    case value_type::reference:
        os << "reference to ";
        if (auto b = v.reference_value().base()) {
            os << b->class_name();
        } else {
            os << "null";
        }
        os << " '" << v.reference_value().property_name().view() << "'";
        break;
    default:
        assert(false);
        os << "[Unhandled type " << v.type() << "]";
    }
}